

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tifuhash.cpp
# Opt level: O2

void tifuhash_64(void *key,int len,uint32_t seed,void *out)

{
  byte *pbVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  double dVar4;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 in_ZMM0 [64];
  undefined1 extraout_var [56];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [64];
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined8 in_XMM8_Qb;
  
  auVar2 = _DAT_00195eb0;
  if (seed != 0) {
    auVar2 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,seed);
    dVar10 = 1.0 / auVar2._0_8_ + auVar2._0_8_;
    dVar4 = pow(dVar10,0.3333333333333333);
    auVar9._0_8_ = pow(dVar10,0.14285714285714285);
    auVar9._8_56_ = extraout_var;
    auVar2._8_8_ = extraout_XMM0_Qb;
    auVar2._0_8_ = dVar4;
    auVar2 = vunpcklpd_avx(auVar2,auVar9._0_16_);
  }
  auVar8._8_8_ = 0x3ff0000000000000;
  auVar8._0_8_ = 0x3ff0000000000000;
  uVar3 = 0;
  auVar9 = ZEXT1664(ZEXT816(0x3ff0000000000000));
  while( true ) {
    auVar6 = vshufpd_avx(auVar2,auVar2,1);
    dVar10 = auVar6._0_8_;
    if ((uint)(~(len >> 0x1f) & len) == uVar3) break;
    pbVar1 = (byte *)((long)key + uVar3);
    dVar4 = (double)(long)uVar3;
    uVar3 = uVar3 + 1;
    auVar11._0_8_ = (double)*pbVar1;
    auVar11._8_8_ = in_XMM8_Qb;
    dVar10 = (auVar11._0_8_ + 1.0 + dVar4) / dVar10;
    auVar12._0_8_ = auVar9._0_8_ / dVar10;
    auVar12._8_8_ = auVar9._8_8_;
    auVar6 = vunpcklpd_avx(auVar8,auVar9._0_16_);
    auVar7 = vunpcklpd_avx(auVar12,auVar11);
    auVar5._0_8_ = auVar2._0_8_ + auVar7._0_8_;
    auVar5._8_8_ = auVar2._8_8_ + auVar7._8_8_;
    auVar2 = vdivpd_avx(auVar6,auVar5);
    auVar9 = ZEXT864((ulong)(dVar10 + 1.0));
  }
  dVar4 = auVar2._0_8_ * (dVar10 + 3.141592653589793);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = dVar4;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = dVar10 * (dVar4 + 2.718281828459045);
  auVar2 = vinsertps_avx(auVar6,auVar7,0x4c);
  auVar8 = vinsertps_avx(auVar6,auVar7,0x1c);
  auVar2 = vpaddd_avx(auVar2,auVar8);
  *(long *)out = auVar2._0_8_;
  return;
}

Assistant:

void tifuhash_64 ( const void * key, int len,
                   uint32_t seed, void * out )
{
  const uint8_t * data = (const uint8_t *)key;
  uint8_t buf [16];
  double * state = (double*)buf;
  uint32_t * state32 = (uint32_t*)buf;
  double seed32 = (double)seed;

  setup( state, seed32 );
  round( data, len, state );

  uint32_t h[2];
  
  h[0] = state32[0] + state32[3];
  h[1] = state32[1] + state32[2];

  ((uint32_t*)out)[0] = h[0];
  ((uint32_t*)out)[1] = h[1];
}